

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

uint __thiscall aiMesh::GetNumColorChannels(aiMesh *this)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 8) {
      return 8;
    }
    if (this->mColors[lVar1] == (aiColor4D *)0x0) break;
    lVar1 = lVar1 + 1;
  }
  return (uint)lVar1;
}

Assistant:

unsigned int GetNumColorChannels() const {
        unsigned int n(0);
        while (n < AI_MAX_NUMBER_OF_COLOR_SETS && mColors[n]) {
            ++n;
        }
        return n;
    }